

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_variable_elimination.cpp
# Opt level: O2

void __thiscall
spvtools::opt::DeadVariableElimination::DeleteVariable
          (DeadVariableElimination *this,uint32_t result_id)

{
  uint32_t uVar1;
  undefined8 in_RAX;
  DefUseManager *pDVar2;
  Instruction *pIVar3;
  mapped_type *pmVar4;
  mapped_type mVar5;
  undefined4 uStack_28;
  uint32_t initializer_id;
  
  _uStack_28 = in_RAX;
  pDVar2 = Pass::get_def_use_mgr((Pass *)this);
  pIVar3 = analysis::DefUseManager::GetDef(pDVar2,result_id);
  if (pIVar3->opcode_ == OpVariable) {
    if ((int)(((long)(pIVar3->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pIVar3->operands_).
                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x30) == 4) {
      pDVar2 = Pass::get_def_use_mgr((Pass *)this);
      uVar1 = Instruction::GetSingleWordOperand(pIVar3,3);
      pIVar3 = analysis::DefUseManager::GetDef(pDVar2,uVar1);
      if (pIVar3->opcode_ == OpVariable) {
        uVar1 = Instruction::result_id(pIVar3);
        _uStack_28 = CONCAT44(uVar1,uStack_28);
        pmVar4 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->reference_count_,&initializer_id);
        if ((*pmVar4 != 0x7fffffff) && (mVar5 = *pmVar4 - 1, *pmVar4 = mVar5, mVar5 == 0)) {
          DeleteVariable(this,initializer_id);
        }
      }
    }
    IRContext::KillDef((this->super_MemPass).super_Pass.context_,result_id);
    return;
  }
  __assert_fail("inst->opcode() == spv::Op::OpVariable && \"Should not be trying to delete anything other than an OpVariable.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dead_variable_elimination.cpp"
                ,0x56,"void spvtools::opt::DeadVariableElimination::DeleteVariable(uint32_t)");
}

Assistant:

void DeadVariableElimination::DeleteVariable(uint32_t result_id) {
  Instruction* inst = get_def_use_mgr()->GetDef(result_id);
  assert(inst->opcode() == spv::Op::OpVariable &&
         "Should not be trying to delete anything other than an OpVariable.");

  // Look for an initializer that references another variable.  We need to know
  // if that variable can be deleted after the reference is removed.
  if (inst->NumOperands() == 4) {
    Instruction* initializer =
        get_def_use_mgr()->GetDef(inst->GetSingleWordOperand(3));

    // TODO: Handle OpSpecConstantOP which might be defined in terms of other
    // variables.  Will probably require a unified dead code pass that does all
    // instruction types.  (Issue 906)
    if (initializer->opcode() == spv::Op::OpVariable) {
      uint32_t initializer_id = initializer->result_id();
      size_t& count = reference_count_[initializer_id];
      if (count != kMustKeep) {
        --count;
      }

      if (count == 0) {
        DeleteVariable(initializer_id);
      }
    }
  }
  context()->KillDef(result_id);
}